

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sh.cpp
# Opt level: O0

void __thiscall CmdSh::CmdSh(CmdSh *this,StrList *opt,StrList *para)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  StrList *local_20;
  StrList *para_local;
  StrList *opt_local;
  CmdSh *this_local;
  
  local_20 = para;
  para_local = opt;
  opt_local = (StrList *)this;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&local_38,opt);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&local_50,para);
  Command::Command(&this->super_Command,&local_38,&local_50);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list(&local_50);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list(&local_38);
  (this->super_Command)._vptr_Command = (_func_int **)&PTR_Execute_0012bae8;
  return;
}

Assistant:

CmdSh::CmdSh(StrList opt, StrList para)
	: Command(opt, para) {}